

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

int readFromSocket(int sck,vector<unsigned_char,_std::allocator<unsigned_char>_> *v,uint size)

{
  ssize_t sVar1;
  uint uVar2;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(v,(ulong)size);
  uVar2 = size;
  do {
    sVar1 = read(sck,(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + (size - uVar2),(long)(int)uVar2);
    uVar2 = uVar2 - (int)sVar1;
  } while( true );
}

Assistant:

int readFromSocket(int sck, std::vector<uint8_t> &v, unsigned int size) {
  v.resize(size);
  int n, toRead = size;
  while ((n = read(sck, &v[size - toRead], toRead)) > 0) {
    toRead -= n;
    if (n <= 0 && toRead != 0) {
      return -1;
    }
  }
}